

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O2

void VP8LConvertFromBGRA(uint32_t *in_data,int num_pixels,WEBP_CSP_MODE out_colorspace,uint8_t *rgba
                        )

{
  VP8LConvertFunc *pp_Var1;
  int iVar2;
  
  switch(out_colorspace) {
  case MODE_RGB:
    pp_Var1 = &VP8LConvertBGRAToRGB;
    break;
  case MODE_RGBA:
    pp_Var1 = &VP8LConvertBGRAToRGBA;
    break;
  case MODE_BGR:
    pp_Var1 = &VP8LConvertBGRAToBGR;
    break;
  case MODE_BGRA:
    memcpy(rgba,in_data,(long)num_pixels << 2);
    return;
  case MODE_ARGB:
    CopyOrSwap(in_data,num_pixels,rgba,0);
    return;
  case MODE_RGBA_4444:
    pp_Var1 = &VP8LConvertBGRAToRGBA4444;
    break;
  case MODE_RGB_565:
    pp_Var1 = &VP8LConvertBGRAToRGB565;
    break;
  case MODE_rgbA:
    (*VP8LConvertBGRAToRGBA)(in_data,num_pixels,rgba);
    goto LAB_00112197;
  case MODE_bgrA:
    memcpy(rgba,in_data,(long)num_pixels << 2);
LAB_00112197:
    iVar2 = 0;
LAB_001121a9:
    (*WebPApplyAlphaMultiply)(rgba,iVar2,num_pixels,1,0);
    return;
  case MODE_Argb:
    CopyOrSwap(in_data,num_pixels,rgba,0);
    iVar2 = 1;
    goto LAB_001121a9;
  case MODE_rgbA_4444:
    (*VP8LConvertBGRAToRGBA4444)(in_data,num_pixels,rgba);
    (*WebPApplyAlphaMultiply4444)(rgba,num_pixels,1,0);
    return;
  default:
    return;
  }
  (**pp_Var1)(in_data,num_pixels,rgba);
  return;
}

Assistant:

void VP8LConvertFromBGRA(const uint32_t* const in_data, int num_pixels,
                         WEBP_CSP_MODE out_colorspace, uint8_t* const rgba) {
  switch (out_colorspace) {
    case MODE_RGB:
      VP8LConvertBGRAToRGB(in_data, num_pixels, rgba);
      break;
    case MODE_RGBA:
      VP8LConvertBGRAToRGBA(in_data, num_pixels, rgba);
      break;
    case MODE_rgbA:
      VP8LConvertBGRAToRGBA(in_data, num_pixels, rgba);
      WebPApplyAlphaMultiply(rgba, 0, num_pixels, 1, 0);
      break;
    case MODE_BGR:
      VP8LConvertBGRAToBGR(in_data, num_pixels, rgba);
      break;
    case MODE_BGRA:
      CopyOrSwap(in_data, num_pixels, rgba, 1);
      break;
    case MODE_bgrA:
      CopyOrSwap(in_data, num_pixels, rgba, 1);
      WebPApplyAlphaMultiply(rgba, 0, num_pixels, 1, 0);
      break;
    case MODE_ARGB:
      CopyOrSwap(in_data, num_pixels, rgba, 0);
      break;
    case MODE_Argb:
      CopyOrSwap(in_data, num_pixels, rgba, 0);
      WebPApplyAlphaMultiply(rgba, 1, num_pixels, 1, 0);
      break;
    case MODE_RGBA_4444:
      VP8LConvertBGRAToRGBA4444(in_data, num_pixels, rgba);
      break;
    case MODE_rgbA_4444:
      VP8LConvertBGRAToRGBA4444(in_data, num_pixels, rgba);
      WebPApplyAlphaMultiply4444(rgba, num_pixels, 1, 0);
      break;
    case MODE_RGB_565:
      VP8LConvertBGRAToRGB565(in_data, num_pixels, rgba);
      break;
    default:
      assert(0);          // Code flow should not reach here.
  }
}